

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::BooleanDatatypeValidator::BooleanDatatypeValidator
          (BooleanDatatypeValidator *this,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,int finalSet,MemoryManager *manager)

{
  int *piVar1;
  XMLCh *text1;
  XMLCh *pattern;
  bool bVar2;
  KVStringPair *toCopy;
  InvalidDatatypeFacetException *pIVar3;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  KVStringPair pair;
  
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,baseValidator,facets,finalSet,Boolean,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__DatatypeValidator_00405628;
  if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      (*(enums->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])(enums);
      pIVar3 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x36,FACET_Invalid_Tag,"enumeration",(char *)0x0,(char *)0x0,(char *)0x0,manager);
      __cxa_throw(pIVar3,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator(&e,facets,false,manager);
    while ((e.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (e.fCurHash != (e.fToEnum)->fHashModulus))) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement(&e);
      KVStringPair::KVStringPair(&pair,toCopy);
      pattern = pair.fValue;
      text1 = pair.fKey;
      bVar2 = XMLString::equals(pair.fKey,(XMLCh *)SchemaSymbols::fgELT_PATTERN);
      if (!bVar2) {
        pIVar3 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                   ,0x4d,FACET_Invalid_Tag,text1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar3,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
      }
      DatatypeValidator::setPattern(&this->super_DatatypeValidator,pattern);
      piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
      *(byte *)piVar1 = (byte)*piVar1 | 8;
      KVStringPair::~KVStringPair(&pair);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&e);
  }
  return;
}

Assistant:

BooleanDatatypeValidator::BooleanDatatypeValidator(
                          DatatypeValidator*            const baseValidator
                        , RefHashTableOf<KVStringPair>* const facets
                        , RefArrayVectorOf<XMLCh>*      const enums
                        , const int                           finalSet
                        , MemoryManager* const                manager)
:DatatypeValidator(baseValidator, facets, finalSet, DatatypeValidator::Boolean, manager)
{

    // Set Facets if any defined
    if ( facets )
    {

        // Boolean shall NOT have enumeration
        if (enums) {
            delete enums;
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                    , XMLExcepts::FACET_Invalid_Tag
                    , "enumeration"
                    , manager);
        }

        XMLCh* key;
        XMLCh* value;
        RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

        while (e.hasMoreElements())
        {
            KVStringPair pair = e.nextElement();
            key = pair.getKey();
            value = pair.getValue();

            if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
            {
                setPattern(value);
                setFacetsDefined(DatatypeValidator::FACET_PATTERN);
            }
            else
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                        , XMLExcepts::FACET_Invalid_Tag
                        , key
                        , manager);
            }

        }

    }// End of facet setting
}